

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.h
# Opt level: O2

int constrain(int diff,int threshold,int damping)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  
  if (threshold != 0) {
    iVar1 = 0x1f;
    if (threshold != 0) {
      for (; (uint)threshold >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar2 = -diff;
    if (0 < diff) {
      uVar2 = diff;
    }
    bVar3 = (char)damping - (char)iVar1;
    if (damping < iVar1) {
      bVar3 = 0;
    }
    uVar4 = threshold - (uVar2 >> (bVar3 & 0x1f));
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    if (uVar2 < uVar4) {
      uVar4 = uVar2;
    }
    uVar2 = -uVar4;
    if (-1 < diff) {
      uVar2 = uVar4;
    }
    return uVar2;
  }
  return 0;
}

Assistant:

static inline int constrain(int diff, int threshold, int damping) {
  if (!threshold) return 0;

  const int shift = AOMMAX(0, damping - get_msb(threshold));
  return sign(diff) *
         AOMMIN(abs(diff), AOMMAX(0, threshold - (abs(diff) >> shift)));
}